

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool readSolutionFileHashKeywordIntLineOk(string *keyword,HighsInt *value,ifstream *in_file)

{
  ulong uVar1;
  istream *in_RDX;
  int *in_RSI;
  string *in_RDI;
  undefined1 local_1;
  
  uVar1 = std::ios::eof();
  if ((uVar1 & 1) == 0) {
    std::operator>>(in_RDX,in_RDI);
    uVar1 = std::ios::eof();
    if ((uVar1 & 1) == 0) {
      std::operator>>(in_RDX,in_RDI);
      uVar1 = std::ios::eof();
      if ((uVar1 & 1) == 0) {
        std::istream::operator>>(in_RDX,in_RSI);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool readSolutionFileHashKeywordIntLineOk(std::string& keyword, HighsInt& value,
                                          std::ifstream& in_file) {
  if (in_file.eof()) return false;
  in_file >> keyword;  // #
  if (in_file.eof()) return false;
  in_file >> keyword;  // keyword
  if (in_file.eof()) return false;
  in_file >> value;  // integer value
  return true;
}